

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::handleInput(Private *this,char *input,usize len)

{
  conchar local_3c;
  uint32 ch;
  usize len_local;
  char *input_local;
  Private *this_local;
  
  if (*input == '\x1b') {
    if (input[1] != '[') {
      return;
    }
    switch(input[2]) {
    case '3':
      if (input[3] == '~') {
        promptRemoveNext(this);
      }
      break;
    case 'A':
      promptHistoryUp(this);
      break;
    case 'B':
      promptHistoryDown(this);
      break;
    case 'C':
      promptMoveRight(this);
      break;
    case 'D':
      promptMoveLeft(this);
      break;
    case 'F':
      promptMoveEnd(this);
      break;
    case 'H':
      promptMoveHome(this);
    }
    return;
  }
  if ((this->utf8 & 1U) == 0) {
    local_3c = (conchar)(byte)*input;
  }
  else {
    local_3c = Unicode::fromString(input,len);
  }
  if (local_3c != 8) {
    if (local_3c == 9) {
      return;
    }
    if (local_3c == 0xd) {
      this->inputComplete = true;
      return;
    }
    if (local_3c != 0x7f) {
      promptInsert(this,local_3c);
      return;
    }
  }
  promptRemove(this);
  return;
}

Assistant:

void handleInput(char* input, usize len)
  {
    if(*input == '\x1b')
    {
      if(input[1] == '[')
        switch(input[2])
        {
        case 'A': // up
          promptHistoryUp();
          break;
        case 'B': // down
          promptHistoryDown();
          break;
        case 'C': // right
          promptMoveRight();
          break;
        case 'D': // left
          promptMoveLeft();
          break;
        case 'H': // home
          promptMoveHome();
          break;
        case 'F': // end
          promptMoveEnd();
          break;
        case '3':
          if(input[3] == '~') // del
            promptRemoveNext();
          break;
        }
    }
    else
    {
      uint32 ch = utf8 ? Unicode::fromString(input, len) : *(uchar*)input;
      switch(ch)
      {
      case '\t':
        break;
      case '\r':
        inputComplete = true;
        break;
      case '\b': // backspace
      case 127: // del
        promptRemove();
        break;
      default:
        promptInsert(ch);
      }
    }
  }